

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
PushBack(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *value,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Number *pNVar1;
  uint uVar2;
  Number NVar3;
  uint uVar4;
  SizeType newCapacity;
  
  if ((this->data_).f.flags == 4) {
    uVar4 = (this->data_).s.length;
    uVar2 = (this->data_).s.hashcode;
    if (uVar2 <= uVar4) {
      newCapacity = 0x10;
      if (uVar2 != 0) {
        newCapacity = (uVar2 + 1 >> 1) + uVar2;
      }
      Reserve(this,newCapacity,allocator);
      uVar4 = (this->data_).s.length;
    }
    (this->data_).s.length = uVar4 + 1;
    NVar3 = (Number)(value->data_).s.str;
    pNVar1 = (Number *)(((ulong)(this->data_).s.str & 0xffffffffffff) + (ulong)uVar4 * 0x10);
    *pNVar1 = (value->data_).n;
    pNVar1[1] = NVar3;
    (value->data_).f.flags = 0;
    return this;
  }
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x6b1,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::PushBack(GenericValue<Encoding, Allocator> &, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsArray()  const { return data_.f.flags == kArrayFlag; }